

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O2

void __thiscall
phosg::BitmapImage::BitmapImage(BitmapImage *this,char *filename,size_t width,size_t height)

{
  unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> f;
  allocator<char> local_62;
  allocator<char> local_61;
  unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> local_60;
  string local_50;
  string local_30;
  
  BitmapImage(this,width,height);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,filename,&local_61);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"rb",&local_62);
  fopen_unique((phosg *)&local_60,&local_30,&local_50,(FILE *)0x0);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_30);
  freadx(local_60._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
         super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.
         super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl,this->data,
         this->row_bytes * this->height);
  ::std::unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)>::~unique_ptr(&local_60);
  return;
}

Assistant:

BitmapImage::BitmapImage(const char* filename, size_t width, size_t height)
    : BitmapImage(width, height) {
  auto f = fopen_unique(filename, "rb");
  freadx(f.get(), this->data, this->get_data_size());
}